

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::objectivec::FieldName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  _Alloc_hider _Var1;
  bool bVar2;
  string result;
  string name;
  string local_98;
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  string local_38;
  
  (anonymous_namespace)::NameFromFieldDescriptor_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)this,field);
  anon_unknown_0::UnderscoresToCamelCase(&local_98,&local_38,false);
  if ((~(byte)this[1] & 0x60) == 0) {
    if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
      local_58._0_8_ = FieldDescriptor::TypeOnceInit;
      local_78._0_8_ = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)local_58,
                 (FieldDescriptor **)local_78);
    }
    if ((this[2] == (objectivec)0xb) &&
       (bVar2 = FieldDescriptor::is_map_message_type((FieldDescriptor *)this), bVar2))
    goto LAB_0026c0bb;
  }
  else {
LAB_0026c0bb:
    _Var1._M_p = local_98._M_dataplus._M_p;
    if ((long)local_98._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_98._M_string_length,"string length exceeds max size");
    }
    else if (local_98._M_string_length < 5) goto LAB_0026c0fc;
    if (_Var1._M_p[local_98._M_string_length - 1] != 'y' ||
        *(int *)(_Var1._M_p + (local_98._M_string_length - 5)) != 0x61727241) goto LAB_0026c0fc;
  }
  std::__cxx11::string::append((char *)&local_98);
LAB_0026c0fc:
  local_58._0_8_ = local_58 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  local_78._0_8_ = (FieldDescriptor *)(local_78 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"_p","");
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,(string *)local_58,&local_98,(string *)local_78,(string *)0x0);
  if ((FieldDescriptor *)local_78._0_8_ != (FieldDescriptor *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_);
  }
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldName(const FieldDescriptor* field) {
  const std::string name = NameFromFieldDescriptor(field);
  std::string result = UnderscoresToCamelCase(name, false);
  if (field->is_repeated() && !field->is_map()) {
    // Add "Array" before do check for reserved worlds.
    result += "Array";
  } else {
    // If it wasn't repeated, but ends in "Array", force on the _p suffix.
    if (HasSuffixString(result, "Array")) {
      result += "_p";
    }
  }
  return SanitizeNameForObjC("", result, "_p", NULL);
}